

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.h
# Opt level: O2

void __thiscall Vector::Normalize(Vector *this)

{
  float fVar1;
  
  fVar1 = Length(this);
  fVar1 = 1.0 / fVar1;
  *(ulong *)this->m_vec =
       CONCAT44(fVar1 * (float)((ulong)*(undefined8 *)this->m_vec >> 0x20),
                fVar1 * (float)*(undefined8 *)this->m_vec);
  this->m_vec[2] = fVar1 * this->m_vec[2];
  this->m_length = 1.0;
  return;
}

Assistant:

void Normalize()
	{
	   float l = 1.f / Length();

	   SetX(X() * l);
	   SetY(Y() * l);
	   SetZ(Z() * l);
	   m_length=1.0f;
	}